

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O0

bool basisu::write_compressed_texture_file
               (char *pFilename,vector<basisu::vector<basisu::gpu_image>_> *g,bool cubemap_flag)

{
  undefined1 uVar1;
  bool bVar2;
  byte in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool in_stack_00000017;
  vector<basisu::vector<basisu::gpu_image>_> *in_stack_00000018;
  uint8_vec filedata;
  string extension;
  undefined4 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3d;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  uint8_vec *v;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  vector<unsigned_char> local_a8;
  string *in_stack_ffffffffffffff68;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string local_60 [32];
  string local_40 [39];
  byte local_19;
  bool local_1;
  
  local_19 = in_DL & 1;
  v = (uint8_vec *)&stack0xffffffffffffff7f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  string_get_extension(in_stack_ffffffffffffff68);
  string_tolower(in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  vector<unsigned_char>::vector(&local_a8);
  uVar1 = std::operator==(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff3f,
                                                  CONCAT16(in_stack_ffffffffffffff3e,
                                                           CONCAT15(in_stack_ffffffffffffff3d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38)))));
  if ((bool)uVar1) {
    bVar2 = create_ktx_texture_file((uint8_vec *)filedata.m_p,in_stack_00000018,in_stack_00000017);
    if (bVar2) {
      local_1 = write_vec_to_file((char *)CONCAT44(in_stack_ffffffffffffff54,
                                                   in_stack_ffffffffffffff50),v);
    }
    else {
      local_1 = false;
    }
  }
  else {
    bVar2 = std::operator==(in_RDI,(char *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff3e,
                                                                   CONCAT15(
                                                  in_stack_ffffffffffffff3d,
                                                  CONCAT14(in_stack_ffffffffffffff3c,
                                                           in_stack_ffffffffffffff38)))));
    if (bVar2) {
      local_1 = false;
    }
    else {
      bVar2 = std::operator==(in_RDI,(char *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff3e,
                                                                     CONCAT15(bVar2,CONCAT14(
                                                  in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38)))));
      if (!bVar2) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                      ,0x627,
                      "bool basisu::write_compressed_texture_file(const char *, const basisu::vector<gpu_image_vec> &, bool)"
                     );
      }
      local_1 = false;
    }
  }
  vector<unsigned_char>::~vector((vector<unsigned_char> *)in_RDI);
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

bool write_compressed_texture_file(const char* pFilename, const basisu::vector<gpu_image_vec>& g, bool cubemap_flag)
	{
		std::string extension(string_tolower(string_get_extension(pFilename)));

		uint8_vec filedata;
		if (extension == "ktx")
		{
			if (!create_ktx_texture_file(filedata, g, cubemap_flag))
				return false;
		}
		else if (extension == "pvr")
		{
			// TODO
			return false;
		}
		else if (extension == "dds")
		{
			// TODO
			return false;
		}
		else
		{
			// unsupported texture format
			assert(0);
			return false;
		}

		return basisu::write_vec_to_file(pFilename, filedata);
	}